

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Str_Ntk_t * Str_ManNormalizeInt(Gia_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Str_Ntk_t *pNtk;
  Str_Obj_t *pSVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x2dd,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    p->vSuper = pVVar6;
  }
  if (p->vStore == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    p->vStore = pVVar6;
  }
  Gia_ManFillValue(p);
  iVar1 = p->nObjs;
  iVar13 = p->vCos->nSize;
  iVar4 = p->nMuxes;
  iVar2 = p->vCis->nSize;
  pNtk = (Str_Ntk_t *)calloc(1,0x50);
  pSVar8 = (Str_Obj_t *)malloc((long)iVar1 << 4);
  pNtk->pObjs = pSVar8;
  pNtk->nObjsAlloc = iVar1;
  if (0 < (long)iVar1) {
    uVar5 = iVar4 + iVar13 + 1 + (~(iVar13 + iVar2) + iVar1) * 2;
    *(undefined8 *)pSVar8 = 1;
    pSVar8->iTop = -1;
    pSVar8->iCopy = -1;
    iVar13 = 1;
    pNtk->nObjCount[1] = 1;
    pNtk->nObjs = 1;
    if (0 < (int)uVar5) {
      piVar7 = (int *)malloc((ulong)uVar5 << 2);
      (pNtk->vFanins).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vFanins).nCap = uVar5;
    }
    p->pObjs->Value = 0;
    iVar4 = 1;
    if (iVar1 != 1) {
      lVar11 = 1;
      iVar13 = 1;
      lVar10 = 0xc;
      do {
        pGVar3 = p->pObjs;
        uVar5 = (uint)*(ulong *)(&pGVar3->field_0x0 + lVar10);
        if ((~uVar5 & 0x9fffffff) == 0) {
          if (pNtk->nObjsAlloc <= iVar13) goto LAB_007e47fd;
          pSVar8 = pNtk->pObjs;
          *(undefined4 *)(pSVar8 + iVar13) = 2;
          pSVar8[iVar13].iOffset = (pNtk->vFanins).nSize;
          pSVar8[iVar13].iTop = -1;
          pSVar8[iVar13].iCopy = -1;
          pNtk->nObjCount[2] = pNtk->nObjCount[2] + 1;
          iVar1 = pNtk->nObjs;
          iVar13 = iVar1 + 1;
          pNtk->nObjs = iVar13;
joined_r0x007e47c5:
          if (iVar1 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          *(int *)((long)&pGVar3->Value + lVar10) = iVar1 * 2;
        }
        else {
          uVar9 = *(ulong *)(&pGVar3->field_0x0 + lVar10) & 0x1fffffff;
          if (uVar9 != 0x1fffffff && (int)uVar5 < 0) {
            Str_ManNormalize_rec
                      (pNtk,p,(Gia_Obj_t *)
                              ((long)pGVar3 + (ulong)(uint)((int)uVar9 << 2) * -3 + lVar10),vGroups,
                       vRoots);
            uVar12 = (uint)*(undefined8 *)(&pGVar3->field_0x0 + lVar10);
            uVar5 = *(uint *)((long)pGVar3 + (ulong)((uVar12 & 0x1fffffff) << 2) * -3 + lVar10 + 8);
            if ((int)uVar5 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            iVar1 = pNtk->nObjs;
            if (iVar1 < pNtk->nObjsAlloc) {
              pSVar8 = pNtk->pObjs;
              *(undefined4 *)(pSVar8 + iVar1) = 0x17;
              pSVar8[iVar1].iOffset = (pNtk->vFanins).nSize;
              pSVar8[iVar1].iTop = -1;
              pSVar8[iVar1].iCopy = -1;
              Vec_IntPush(&pNtk->vFanins,uVar12 >> 0x1d & 1 ^ uVar5);
              pNtk->nObjCount[7] = pNtk->nObjCount[7] + 1;
              iVar1 = pNtk->nObjs;
              iVar13 = iVar1 + 1;
              pNtk->nObjs = iVar13;
              goto joined_r0x007e47c5;
            }
            goto LAB_007e47fd;
          }
        }
        lVar11 = lVar11 + 1;
        iVar4 = p->nObjs;
        lVar10 = lVar10 + 0xc;
      } while (lVar11 < iVar4);
    }
    if (iVar13 <= iVar4) {
      return pNtk;
    }
    __assert_fail("pNtk->nObjs <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x2f0,"Str_Ntk_t *Str_ManNormalizeInt(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
LAB_007e47fd:
  __assert_fail("p->nObjs < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,0x70,"int Str_ObjCreate(Str_Ntk_t *, int, int, int *)");
}

Assistant:

Str_Ntk_t * Str_ManNormalizeInt( Gia_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vRoots )
{
    Str_Ntk_t * pNtk;
    Gia_Obj_t * pObj;
    int i, iFanin;
    assert( p->pMuxes != NULL );
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( STR_SUPER );
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( STR_SUPER );
    Gia_ManFillValue( p );
    pNtk = Str_NtkCreate( Gia_ManObjNum(p), 1 + Gia_ManCoNum(p) + 2 * Gia_ManAndNum(p) + Gia_ManMuxNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Str_ObjCreate( pNtk, STR_PI, 0, NULL );
        else if ( Gia_ObjIsCo(pObj) )
        {
            Str_ManNormalize_rec( pNtk, p, Gia_ObjFanin0(pObj), vGroups, vRoots );
            iFanin = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Str_ObjCreate( pNtk, STR_PO, 1, &iFanin );
        }
    }
    assert( pNtk->nObjs <= Gia_ManObjNum(p) );
    return pNtk;
}